

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::
HashIndex<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>
::
insert<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry,kj::ArrayPtr<unsigned_char_const>&>
          (HashIndex<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>
           *this,ArrayPtr<kj::HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry>
                 table,size_t pos,StringPtr *params)

{
  size_t *psVar1;
  int iVar2;
  Disposer *pDVar3;
  Vat *pVVar4;
  uchar *__s2;
  size_t sVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar9;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 __n;
  Entry *this_00;
  ArrayPtr<const_unsigned_char> *in_R9;
  uint uVar10;
  Vat *pVVar11;
  HashBucket *_s944;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar12;
  Maybe<unsigned_long> MVar13;
  
  this_00 = table.ptr;
  if ((ulong)((long)(this_00->value).ptr * 2) < ((this_00->key).content.size_ + pos) * 3 + 3) {
    HashIndex<kj::HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>
    ::rehash((HashIndex<kj::HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>
              *)this_00,pos * 3 + 3);
  }
  uVar6 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,*in_R9);
  pDVar3 = (this_00->value).disposer;
  pVVar4 = (this_00->value).ptr;
  __s2 = in_R9->ptr;
  sVar5 = in_R9->size_;
  paVar12 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0;
  uVar10 = (int)pVVar4 - 1U & uVar6;
  do {
    paVar9 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(pDVar3 + uVar10);
    iVar2 = *(int *)((long)paVar9 + 4);
    if (iVar2 == 1) {
      if (paVar12 == (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
        paVar12 = paVar9;
      }
    }
    else {
      if (iVar2 == 0) {
        if (paVar12 != (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
          psVar1 = &(this_00->key).content.size_;
          *psVar1 = *psVar1 - 1;
          paVar9 = paVar12;
        }
        __n.value = ((ulong)uVar6 | (long)params << 0x20) + 0x200000000;
        paVar9->value = (unsigned_long)__n;
        *this = (HashIndex<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>
                 )0x0;
        goto LAB_0034f77e;
      }
      if (*(uint *)paVar9 == uVar6) {
        lVar8 = (ulong)(iVar2 - 2) * 0x38;
        __n = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
              ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
              (table.size_ + 8 + lVar8))->value;
        if ((__n.value == sVar5) &&
           ((__n.value == 0 ||
            (iVar7 = bcmp(*(void **)(table.size_ + lVar8),__s2,__n.value), __n = extraout_RDX,
            iVar7 == 0)))) {
          *this = (HashIndex<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>
                   )0x1;
          *(ulong *)(this + 8) = (ulong)(iVar2 - 2);
LAB_0034f77e:
          MVar13.ptr.field_1.value = __n.value;
          MVar13.ptr._0_8_ = this;
          return (Maybe<unsigned_long>)MVar13.ptr;
        }
      }
    }
    pVVar11 = (Vat *)((ulong)uVar10 + 1);
    uVar10 = (uint)pVVar11;
    if (pVVar11 == pVVar4) {
      uVar10 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash so that it's 1/3, i.e. double the buckets.
      // Note that rehashing also cleans up erased entries, so we may not actually be doubling if
      // there are a lot of erasures. Nevertheless, this gives us amortized constant time -- it
      // would take at least O(table.size()) more insertions (whether or not erasures occur)
      // before another rehash is needed.
      rehash((table.size() + 1) * 3);
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_SOME(s, erasedSlot) {
          --erasedCount;
          s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return kj::none;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == kj::none) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }